

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O0

MIDIDevice * __thiscall MIDIStreamer::CreateMIDIDevice(MIDIStreamer *this,EMidiDevice devtype)

{
  char *pcVar1;
  CRecoverableError *err;
  EMidiDevice devtype_local;
  MIDIStreamer *this_local;
  
  switch(devtype) {
  case MDEV_MMAPI:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_midistream.cpp"
                  ,0x10b,"MIDIDevice *MIDIStreamer::CreateMIDIDevice(EMidiDevice) const");
  case MDEV_OPL:
    this_local = (MIDIStreamer *)operator_new(0xcf8);
    pcVar1 = FString::operator_cast_to_char_(&this->Args);
    OPLMIDIDevice::OPLMIDIDevice((OPLMIDIDevice *)this_local,pcVar1);
    break;
  case MDEV_SNDSYS:
    this_local = (MIDIStreamer *)operator_new(0x18);
    SndSysMIDIDevice::SndSysMIDIDevice((SndSysMIDIDevice *)this_local);
    break;
  case MDEV_TIMIDITY:
    this_local = (MIDIStreamer *)operator_new(0x40);
    pcVar1 = FString::operator_cast_to_char_(&this->Args);
    TimidityPPMIDIDevice::TimidityPPMIDIDevice((TimidityPPMIDIDevice *)this_local,pcVar1);
    break;
  case MDEV_FLUIDSYNTH:
    this_local = (MIDIStreamer *)operator_new(0x70);
    pcVar1 = FString::operator_cast_to_char_(&this->Args);
    FluidSynthMIDIDevice::FluidSynthMIDIDevice((FluidSynthMIDIDevice *)this_local,pcVar1);
    break;
  case MDEV_GUS:
    this_local = (MIDIStreamer *)operator_new(0x68);
    pcVar1 = FString::operator_cast_to_char_(&this->Args);
    TimidityMIDIDevice::TimidityMIDIDevice((TimidityMIDIDevice *)this_local,pcVar1);
    break;
  case MDEV_WILDMIDI:
    this_local = (MIDIStreamer *)operator_new(0x68);
    pcVar1 = FString::operator_cast_to_char_(&this->Args);
    WildMIDIDevice::WildMIDIDevice((WildMIDIDevice *)this_local,pcVar1);
    break;
  default:
    this_local = (MIDIStreamer *)0x0;
  }
  return (MIDIDevice *)this_local;
}

Assistant:

MIDIDevice *MIDIStreamer::CreateMIDIDevice(EMidiDevice devtype) const
{
	switch (devtype)
	{
	case MDEV_MMAPI:
#ifdef _WIN32
		return new WinMIDIDevice(mididevice);
#endif
		assert(0);
		// Intentional fall-through for non-Windows systems.

#ifdef HAVE_FLUIDSYNTH
	case MDEV_FLUIDSYNTH:
		return new FluidSynthMIDIDevice(Args);
#endif

	case MDEV_SNDSYS:
		return new SndSysMIDIDevice;

	case MDEV_GUS:
		return new TimidityMIDIDevice(Args);

	case MDEV_OPL:
		try
		{
			return new OPLMIDIDevice(Args);
		}
		catch (CRecoverableError &err)
		{
			// The creation of an OPL MIDI device can abort with an error if no GENMIDI lump can be found.
			Printf("Unable to create OPL MIDI device: %s\nFalling back to Sound System playback", err.GetMessage());
			return new SndSysMIDIDevice;
		}

	case MDEV_TIMIDITY:
		return new TimidityPPMIDIDevice(Args);

	case MDEV_WILDMIDI:
		return new WildMIDIDevice(Args);

	default:
		return NULL;
	}
}